

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O2

void __thiscall tt::net::HttpData::reset(HttpData *this)

{
  undefined1 auVar1 [8];
  weak_ptr<tt::net::TimerNode> *this_00;
  undefined1 local_28 [8];
  shared_ptr<tt::net::TimerNode> my_timer;
  
  (this->fileName_)._M_string_length = 0;
  *(this->fileName_)._M_dataplus._M_p = '\0';
  (this->path_)._M_string_length = 0;
  *(this->path_)._M_dataplus._M_p = '\0';
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers_)._M_t);
  this_00 = &this->timer_;
  std::__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2> *)local_28,this_00);
  auVar1 = local_28;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&my_timer);
  if (auVar1 != (undefined1  [8])0x0) {
    std::__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2> *)local_28,this_00);
    TimerNode::clearReq((TimerNode *)local_28);
    std::__weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&my_timer);
  }
  return;
}

Assistant:

void HttpData::reset() {
  // inBuffer_.clear();
  fileName_.clear();
  path_.clear();
  nowReadPos_ = 0;
  state_ = STATE_PARSE_URI;
  hState_ = H_START;
  headers_.clear();
  // keepAlive_ = false;
  if (timer_.lock()) {
	  std::shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}